

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_io_dp.c
# Opt level: O0

int dynamicGetbuf(gdIOCtxPtr ctx,void *buf,int len)

{
  _func_int_gdIOCtx_ptr *p_Var1;
  int iVar2;
  dynamicPtr *dp;
  dpIOCtxPtr dctx;
  int local_28;
  int remain;
  int rlen;
  int len_local;
  void *buf_local;
  gdIOCtxPtr ctx_local;
  
  p_Var1 = ctx[1].getC;
  if ((*(int *)(p_Var1 + 0x14) < 0) || (*(int *)(p_Var1 + 0xc) <= *(int *)(p_Var1 + 0x14))) {
    ctx_local._4_4_ = 0;
  }
  else {
    iVar2 = *(int *)(p_Var1 + 8) - *(int *)(p_Var1 + 0x14);
    local_28 = len;
    if ((iVar2 < len) && (local_28 = iVar2, iVar2 < 1)) {
      ctx_local._4_4_ = 0;
    }
    else {
      if (*(int *)(p_Var1 + 0xc) < *(int *)(p_Var1 + 0x14) + local_28) {
        local_28 = *(int *)(p_Var1 + 0xc) - *(int *)(p_Var1 + 0x14);
      }
      if (local_28 < 0) {
        ctx_local._4_4_ = 0;
      }
      else {
        memcpy(buf,(void *)(*(long *)p_Var1 + (long)*(int *)(p_Var1 + 0x14)),(long)local_28);
        *(int *)(p_Var1 + 0x14) = local_28 + *(int *)(p_Var1 + 0x14);
        ctx_local._4_4_ = local_28;
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static int dynamicGetbuf(gdIOCtxPtr ctx, void *buf, int len)
{
	int rlen, remain;
	dpIOCtxPtr dctx;
	dynamicPtr *dp;

	dctx = (dpIOCtxPtr) ctx;
	dp = dctx->dp;

	if (dp->pos < 0 || dp->pos >= dp->realSize) {
		return 0;
	}

	remain = dp->logicalSize - dp->pos;
	if(remain >= len) {
		rlen = len;
	} else {
		if(remain <= 0) {
			return 0;
		}

		rlen = remain;
	}

	if (dp->pos + rlen > dp->realSize) {
		rlen = dp->realSize - dp->pos;
	}

	if (rlen < 0) {
		return 0;
	}

	memcpy(buf, (void *) ((char *)dp->data + dp->pos), rlen);
	dp->pos += rlen;

	return rlen;
}